

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O1

void la_miam_xon_ind_format_json(la_vstring *vstr,void *data)

{
  la_json_append_bool(vstr,"all_files",*data == 0xfff);
  if ((ulong)*data != 0xfff) {
    la_json_append_int64(vstr,"file_id",(ulong)*data);
  }
  la_json_append_int64(vstr,"on_ground_seg_temp_secs",(ulong)*(ushort *)((long)data + 2));
  la_json_append_int64(vstr,"in_flight_seg_temp_secs",(ulong)*(ushort *)((long)data + 4));
  return;
}

Assistant:

static void la_miam_xon_ind_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_xon_ind_msg const *msg = data;
	la_json_append_bool(vstr, "all_files", msg->file_id == 0xFFF);
	if(msg->file_id != 0xFFF) {
		la_json_append_int64(vstr, "file_id", msg->file_id);
	}
	la_json_append_int64(vstr, "on_ground_seg_temp_secs", msg->onground_segment_tempo);
	la_json_append_int64(vstr, "in_flight_seg_temp_secs", msg->inflight_segment_tempo);
}